

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * __thiscall Json::Value::toStyledString_abi_cxx11_(Value *this)

{
  size_t in_RCX;
  void *in_RSI;
  StyledWriter *in_RDI;
  StyledWriter writer;
  StyledWriter *this_00;
  undefined1 local_80 [128];
  
  this_00 = in_RDI;
  StyledWriter::StyledWriter(in_RDI);
  StyledWriter::write_abi_cxx11_(in_RDI,(int)local_80,in_RSI,in_RCX);
  StyledWriter::~StyledWriter(this_00);
  return (string *)this_00;
}

Assistant:

std::string Value::toStyledString() const {
  StyledWriter writer;
  return writer.write(*this);
}